

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bash_bench.c
# Opt level: O3

bool_t bashBench(void)

{
  u32 seed;
  size_t sVar1;
  tm_ticks_t tVar2;
  tm_ticks_t tVar3;
  bool_t bVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  octet hash [64];
  octet belt_state [256];
  octet buf [1024];
  octet combo_state [256];
  octet bash_state [1024];
  octet local_a78 [64];
  undefined1 local_a38 [256];
  undefined1 local_938 [1024];
  undefined1 local_538 [256];
  undefined1 local_438 [1032];
  
  bVar4 = 0;
  sVar1 = beltHash_keep();
  if (sVar1 < 0x101) {
    bVar4 = 0;
    sVar1 = bashPrg_keep();
    if (sVar1 < 0x401) {
      bVar4 = 0;
      sVar1 = bashHash_keep();
      if (sVar1 < 0x401) {
        bVar4 = 0;
        sVar1 = prngCOMBO_keep();
        if (sVar1 < 0x101) {
          seed = utilNonce32();
          prngCOMBOStart(local_538,seed);
          prngCOMBOStepR(local_938,0x400,local_538);
          printf("bashBench::platform = %s\n","BASH_64");
          beltHashStart(local_a38);
          tVar2 = tmTicks();
          lVar6 = 2000;
          do {
            beltHashStepH(local_938,0x400,local_a38);
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
          beltHashStepG(local_a78,local_a38);
          tVar3 = tmTicks();
          sVar1 = tmSpeed(2000,tVar3 - tVar2);
          printf("bashBench::belt-hash: %3u cpb [%5u kBytes/sec]\n",
                 (tVar3 - tVar2) / 0x1f4000 & 0xffffffff,sVar1 & 0xffffffff);
          uVar5 = 0x80;
          do {
            bashHashStart(local_438,uVar5);
            tVar2 = tmTicks();
            lVar6 = 2000;
            do {
              bashHashStepH(local_938,0x400,local_438);
              lVar6 = lVar6 + -1;
            } while (lVar6 != 0);
            bashHashStepG(local_a78,uVar5 >> 2,local_438);
            tVar3 = tmTicks();
            sVar1 = tmSpeed(2000,tVar3 - tVar2);
            printf("bashBench::bash%u: %3u cpb [%5u kBytes/sec]\n",(ulong)(uint)((int)uVar5 * 2),
                   (tVar3 - tVar2) / 0x1f4000 & 0xffffffff,sVar1 & 0xffffffff);
            bVar8 = uVar5 < 0xc1;
            uVar5 = uVar5 + 0x40;
          } while (bVar8);
          uVar5 = 0x80;
          do {
            uVar7 = 1;
            do {
              bashPrgStart(local_438,uVar5,uVar7,local_a78,uVar5 >> 3,(octet *)0x0,0);
              bashPrgAbsorbStart(local_438);
              tVar2 = tmTicks();
              lVar6 = 2000;
              do {
                bashPrgAbsorbStep(local_938,0x400,local_438);
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
              bashPrgSqueeze(local_a78,uVar5 >> 2,local_438);
              tVar3 = tmTicks();
              tmSpeed(2000,tVar3 - tVar2);
              printf("bashBench::bash-prg-hash%u%u: %3u cpb [%5u kBytes/sec]\n",
                     (ulong)(uint)((int)uVar5 * 2),uVar7 & 0xffffffff);
              uVar7 = uVar7 + 1;
            } while (uVar7 != 3);
            bVar8 = uVar5 < 0xc1;
            uVar5 = uVar5 + 0x40;
          } while (bVar8);
          uVar5 = 0x80;
          do {
            uVar7 = 1;
            do {
              bashPrgStart(local_438,uVar5,uVar7,(octet *)0x0,0,local_a78,uVar5 >> 3);
              bashPrgEncrStart(local_438);
              tmTicks();
              lVar6 = 2000;
              do {
                bashPrgEncrStep(local_938,0x400,local_438);
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
              bashPrgDecrStart(local_438);
              tVar2 = tmTicks();
              lVar6 = 2000;
              do {
                bashPrgDecrStep(local_938,0x400,local_438);
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
              tVar3 = tmTicks();
              tmSpeed(4000,tVar3 - tVar2);
              printf("bashBench::bash-prg-ae%u%u: %3u cpb [%5u kBytes/sec]\n",uVar5 & 0xffffffff,
                     uVar7 & 0xffffffff);
              uVar7 = uVar7 + 1;
            } while (uVar7 != 3);
            bVar8 = uVar5 < 0xc1;
            uVar5 = uVar5 + 0x40;
          } while (bVar8);
          bVar4 = 1;
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool_t bashBench()
{
	octet belt_state[256];
	octet bash_state[1024];
	octet combo_state[256];
	octet buf[1024];
	octet hash[64];
	size_t l, d;
	// подготовить память
	if (sizeof(belt_state) < beltHash_keep() ||
		sizeof(bash_state) < bashPrg_keep() ||
		sizeof(bash_state) < bashHash_keep() ||
		sizeof(combo_state) < prngCOMBO_keep())
		return FALSE;
	// заполнить buf псевдослучайными числами
	prngCOMBOStart(combo_state, utilNonce32());
	prngCOMBOStepR(buf, sizeof(buf), combo_state);
	// платформа
	printf("bashBench::platform = %s\n", bash_platform);
	// оценить скорость хэширования
	{
		const size_t reps = 2000;
		size_t i;
		tm_ticks_t ticks;
		// эксперимент c belt
		beltHashStart(belt_state);
		for (i = 0, ticks = tmTicks(); i < reps; ++i)
			beltHashStepH(buf, sizeof(buf), belt_state);
		beltHashStepG(hash, belt_state);
		ticks = tmTicks() - ticks;
		printf("bashBench::belt-hash: %3u cpb [%5u kBytes/sec]\n",
			(unsigned)(ticks / 1024 / reps),
			(unsigned)tmSpeed(reps, ticks));
		// эксперимент c bashHashLLL
		for (l = 128; l <= 256; l += 64)
		{
			bashHashStart(bash_state, l);
			for (i = 0, ticks = tmTicks(); i < reps; ++i)
				bashHashStepH(buf, sizeof(buf), bash_state);
			bashHashStepG(hash, l / 4, bash_state);
			ticks = tmTicks() - ticks;
			printf("bashBench::bash%u: %3u cpb [%5u kBytes/sec]\n",
				(unsigned)(2 * l),
				(unsigned)(ticks / sizeof(buf) / reps),
				(unsigned)tmSpeed(reps, ticks));
		}
		// эксперимент с bash-prg-hashLLLD
		for (l = 128; l <= 256; l += 64)
		for (d = 1; d <= 2; ++d)
		{
			bashPrgStart(bash_state, l, d, hash, l / 8, 0, 0);
			bashPrgAbsorbStart(bash_state);
			for (i = 0, ticks = tmTicks(); i < reps; ++i)
				bashPrgAbsorbStep(buf, 1024, bash_state);
			bashPrgSqueeze(hash, l / 4, bash_state);
			ticks = tmTicks() - ticks;
			printf("bashBench::bash-prg-hash%u%u: %3u cpb [%5u kBytes/sec]\n",
				(unsigned)(2 * l), (unsigned)d,
				(unsigned)(ticks / sizeof(buf) / reps),
				(unsigned)tmSpeed(reps, ticks));
		}
		// эксперимент с bash-prg-aeLLLD
		for (l = 128; l <= 256; l += 64)
		for (d = 1; d <= 2; ++d)
		{
			bashPrgStart(bash_state, l, d, 0, 0, hash, l / 8);
			bashPrgEncrStart(bash_state);
			for (i = 0, ticks = tmTicks(); i < reps; ++i)
				bashPrgEncrStep(buf, 1024, bash_state);
			bashPrgDecrStart(bash_state);
			for (i = 0, ticks = tmTicks(); i < reps; ++i)
				bashPrgDecrStep(buf, 1024, bash_state);
			ticks = tmTicks() - ticks;
			printf("bashBench::bash-prg-ae%u%u: %3u cpb [%5u kBytes/sec]\n",
				(unsigned)l, (unsigned)d,
				(unsigned)(ticks / (2 * sizeof(buf)) / reps),
				(unsigned)tmSpeed(2 * reps, ticks));
		}
	}
	// все нормально
	return TRUE;
}